

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t coda_strnspc(char *s,char *n,size_t len)

{
  char *x;
  char *e;
  char *p;
  size_t len_local;
  char *n_local;
  char *s_local;
  size_t local_8;
  
  for (p = s; x = n, p < s + len; p = p + 1) {
    for (; *x != '\0'; x = x + 1) {
      if (*p == *x) goto LAB_0010b196;
    }
  }
LAB_0010b196:
  local_8 = (long)p - (long)s;
  return local_8;
}

Assistant:

size_t coda_strnspc(const char *s, const char *n, size_t len)
{
	const char *p = s;
	const char *e = s + len;
	const char *x;

	for (; p < e; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) return p - s;
		}
	}

	return p - s;
}